

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 (*pauVar7) [16];
  int iVar8;
  undefined4 uVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [32];
  undefined1 auVar36 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  float fVar82;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar89;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar90 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar103;
  float fVar104;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1389;
  ulong local_1388;
  long local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  Scene *local_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  size_t local_12f0;
  RayHitK<8> *local_12e8;
  long local_12e0;
  ulong local_12d8;
  RTCFilterFunctionNArguments local_12d0;
  undefined1 local_12a0 [16];
  float local_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 *local_1260;
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [32];
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float local_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float local_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar18 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1140._4_4_ = uVar9;
  local_1140._0_4_ = uVar9;
  local_1140._8_4_ = uVar9;
  local_1140._12_4_ = uVar9;
  auVar78 = ZEXT1664(local_1140);
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1150._4_4_ = uVar9;
  local_1150._0_4_ = uVar9;
  local_1150._8_4_ = uVar9;
  local_1150._12_4_ = uVar9;
  auVar80 = ZEXT1664(local_1150);
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1160._4_4_ = uVar9;
  local_1160._0_4_ = uVar9;
  local_1160._8_4_ = uVar9;
  local_1160._12_4_ = uVar9;
  auVar81 = ZEXT1664(local_1160);
  fVar95 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar104 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar110 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar82 = fVar95 * 0.99999964;
  fVar89 = fVar104 * 0.99999964;
  fVar94 = fVar110 * 0.99999964;
  fVar95 = fVar95 * 1.0000004;
  fVar104 = fVar104 * 1.0000004;
  fVar110 = fVar110 * 1.0000004;
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_12d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar22 = uVar17 ^ 0x10;
  uVar19 = local_12d8 ^ 0x10;
  iVar8 = (tray->tnear).field_0.i[k];
  local_12a0._4_4_ = iVar8;
  local_12a0._0_4_ = iVar8;
  local_12a0._8_4_ = iVar8;
  local_12a0._12_4_ = iVar8;
  auVar74 = ZEXT1664(local_12a0);
  iVar8 = (tray->tfar).field_0.i[k];
  auVar28 = ZEXT1664(CONCAT412(iVar8,CONCAT48(iVar8,CONCAT44(iVar8,iVar8))));
  iVar8 = 1 << ((uint)k & 0x1f);
  auVar37._4_4_ = iVar8;
  auVar37._0_4_ = iVar8;
  auVar37._8_4_ = iVar8;
  auVar37._12_4_ = iVar8;
  auVar37._16_4_ = iVar8;
  auVar37._20_4_ = iVar8;
  auVar37._24_4_ = iVar8;
  auVar37._28_4_ = iVar8;
  auVar6 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar37 = vpand_avx2(auVar37,auVar6);
  local_10e0 = vpcmpeqd_avx2(auVar37,auVar6);
  local_1170 = fVar82;
  fStack_116c = fVar82;
  fStack_1168 = fVar82;
  fStack_1164 = fVar82;
  local_1180 = fVar89;
  fStack_117c = fVar89;
  fStack_1178 = fVar89;
  fStack_1174 = fVar89;
  local_1190 = fVar94;
  fStack_118c = fVar94;
  fStack_1188 = fVar94;
  fStack_1184 = fVar94;
  local_11a0 = fVar95;
  fStack_119c = fVar95;
  fStack_1198 = fVar95;
  fStack_1194 = fVar95;
  local_11b0 = fVar104;
  fStack_11ac = fVar104;
  fStack_11a8 = fVar104;
  fStack_11a4 = fVar104;
  local_11c0 = fVar110;
  fStack_11bc = fVar110;
  fStack_11b8 = fVar110;
  fStack_11b4 = fVar110;
  fVar86 = fVar82;
  fVar87 = fVar82;
  fVar88 = fVar82;
  fVar91 = fVar89;
  fVar92 = fVar89;
  fVar93 = fVar89;
  fVar96 = fVar94;
  fVar99 = fVar94;
  fVar101 = fVar94;
  fVar103 = fVar95;
  fVar100 = fVar95;
  fVar102 = fVar95;
  fVar107 = fVar104;
  fVar108 = fVar104;
  fVar109 = fVar104;
  fVar111 = fVar110;
  fVar112 = fVar110;
  fVar113 = fVar110;
  local_1388 = uVar17;
  local_12f0 = k;
  local_12e8 = ray;
LAB_015f08fb:
  do {
    do {
      if (pauVar18 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar7 = pauVar18 + -1;
      pauVar18 = pauVar18 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar7 + 8));
    uVar20 = *(ulong *)*pauVar18;
    while ((uVar20 & 8) == 0) {
      uVar10 = uVar20 & 0xfffffffffffffff0;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar29._4_4_ = uVar9;
      auVar29._0_4_ = uVar9;
      auVar29._8_4_ = uVar9;
      auVar29._12_4_ = uVar9;
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar17),auVar29,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar17));
      auVar31 = vsubps_avx(auVar31,auVar78._0_16_);
      auVar30._0_4_ = fVar82 * auVar31._0_4_;
      auVar30._4_4_ = fVar86 * auVar31._4_4_;
      auVar30._8_4_ = fVar87 * auVar31._8_4_;
      auVar30._12_4_ = fVar88 * auVar31._12_4_;
      auVar31 = vmaxps_avx(auVar74._0_16_,auVar30);
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + local_12d8),auVar29,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + local_12d8));
      auVar30 = vsubps_avx(auVar30,auVar80._0_16_);
      auVar47._0_4_ = fVar89 * auVar30._0_4_;
      auVar47._4_4_ = fVar91 * auVar30._4_4_;
      auVar47._8_4_ = fVar92 * auVar30._8_4_;
      auVar47._12_4_ = fVar93 * auVar30._12_4_;
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar21),auVar29,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar21));
      auVar30 = vsubps_avx(auVar30,auVar81._0_16_);
      auVar53._0_4_ = fVar94 * auVar30._0_4_;
      auVar53._4_4_ = fVar96 * auVar30._4_4_;
      auVar53._8_4_ = fVar99 * auVar30._8_4_;
      auVar53._12_4_ = fVar101 * auVar30._12_4_;
      auVar30 = vmaxps_avx(auVar47,auVar53);
      auVar31 = vmaxps_avx(auVar31,auVar30);
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar22),auVar29,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar22));
      auVar30 = vsubps_avx(auVar30,auVar78._0_16_);
      auVar48._0_4_ = fVar95 * auVar30._0_4_;
      auVar48._4_4_ = fVar103 * auVar30._4_4_;
      auVar48._8_4_ = fVar100 * auVar30._8_4_;
      auVar48._12_4_ = fVar102 * auVar30._12_4_;
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar19),auVar29,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar19));
      auVar30 = vminps_avx(auVar28._0_16_,auVar48);
      auVar47 = vsubps_avx(auVar47,auVar80._0_16_);
      auVar54._0_4_ = fVar104 * auVar47._0_4_;
      auVar54._4_4_ = fVar107 * auVar47._4_4_;
      auVar54._8_4_ = fVar108 * auVar47._8_4_;
      auVar54._12_4_ = fVar109 * auVar47._12_4_;
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + (uVar21 ^ 0x10)),auVar29,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + (uVar21 ^ 0x10)));
      auVar47 = vsubps_avx(auVar47,auVar81._0_16_);
      auVar63._0_4_ = fVar110 * auVar47._0_4_;
      auVar63._4_4_ = fVar111 * auVar47._4_4_;
      auVar63._8_4_ = fVar112 * auVar47._8_4_;
      auVar63._12_4_ = fVar113 * auVar47._12_4_;
      auVar47 = vminps_avx(auVar54,auVar63);
      auVar30 = vminps_avx(auVar30,auVar47);
      if (((uint)uVar20 & 7) == 6) {
        auVar47 = vcmpps_avx(auVar31,auVar30,2);
        auVar30 = vcmpps_avx(*(undefined1 (*) [16])(uVar10 + 0xe0),auVar29,2);
        auVar29 = vcmpps_avx(auVar29,*(undefined1 (*) [16])(uVar10 + 0xf0),1);
        auVar30 = vandps_avx(auVar30,auVar29);
        auVar30 = vandps_avx(auVar30,auVar47);
      }
      else {
        auVar30 = vcmpps_avx(auVar31,auVar30,2);
      }
      auVar30 = vpslld_avx(auVar30,0x1f);
      uVar11 = vmovmskps_avx(auVar30);
      local_10c0[0] = (RTCHitN)auVar31[0];
      local_10c0[1] = (RTCHitN)auVar31[1];
      local_10c0[2] = (RTCHitN)auVar31[2];
      local_10c0[3] = (RTCHitN)auVar31[3];
      local_10c0[4] = (RTCHitN)auVar31[4];
      local_10c0[5] = (RTCHitN)auVar31[5];
      local_10c0[6] = (RTCHitN)auVar31[6];
      local_10c0[7] = (RTCHitN)auVar31[7];
      local_10c0[8] = (RTCHitN)auVar31[8];
      local_10c0[9] = (RTCHitN)auVar31[9];
      local_10c0[10] = (RTCHitN)auVar31[10];
      local_10c0[0xb] = (RTCHitN)auVar31[0xb];
      local_10c0[0xc] = (RTCHitN)auVar31[0xc];
      local_10c0[0xd] = (RTCHitN)auVar31[0xd];
      local_10c0[0xe] = (RTCHitN)auVar31[0xe];
      local_10c0[0xf] = (RTCHitN)auVar31[0xf];
      if (uVar11 == 0) goto LAB_015f08fb;
      uVar11 = uVar11 & 0xff;
      lVar16 = 0;
      for (uVar20 = (ulong)uVar11; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        lVar16 = lVar16 + 1;
      }
      uVar20 = *(ulong *)(uVar10 + lVar16 * 8);
      uVar11 = uVar11 - 1 & uVar11;
      uVar12 = (ulong)uVar11;
      if (uVar11 != 0) {
        uVar2 = *(uint *)(local_10c0 + lVar16 * 4);
        lVar16 = 0;
        for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        uVar11 = uVar11 - 1 & uVar11;
        uVar15 = (ulong)uVar11;
        uVar12 = *(ulong *)(uVar10 + lVar16 * 8);
        uVar3 = *(uint *)(local_10c0 + lVar16 * 4);
        uVar17 = local_1388;
        if (uVar11 == 0) {
          if (uVar2 < uVar3) {
            *(ulong *)*pauVar18 = uVar12;
            *(uint *)(*pauVar18 + 8) = uVar3;
            pauVar18 = pauVar18 + 1;
          }
          else {
            *(ulong *)*pauVar18 = uVar20;
            *(uint *)(*pauVar18 + 8) = uVar2;
            pauVar18 = pauVar18 + 1;
            uVar20 = uVar12;
          }
        }
        else {
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar20;
          auVar31 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar2));
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar12;
          auVar30 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar3));
          lVar16 = 0;
          for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar11 = uVar11 - 1 & uVar11;
          uVar20 = (ulong)uVar11;
          auVar49._8_8_ = 0;
          auVar49._0_8_ = *(ulong *)(uVar10 + lVar16 * 8);
          auVar29 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_10c0 + lVar16 * 4)));
          auVar47 = vpcmpgtd_avx(auVar30,auVar31);
          if (uVar11 == 0) {
            auVar48 = vpshufd_avx(auVar47,0xaa);
            auVar47 = vblendvps_avx(auVar30,auVar31,auVar48);
            auVar31 = vblendvps_avx(auVar31,auVar30,auVar48);
            auVar30 = vpcmpgtd_avx(auVar29,auVar47);
            auVar48 = vpshufd_avx(auVar30,0xaa);
            auVar30 = vblendvps_avx(auVar29,auVar47,auVar48);
            auVar47 = vblendvps_avx(auVar47,auVar29,auVar48);
            auVar29 = vpcmpgtd_avx(auVar47,auVar31);
            auVar48 = vpshufd_avx(auVar29,0xaa);
            auVar29 = vblendvps_avx(auVar47,auVar31,auVar48);
            auVar31 = vblendvps_avx(auVar31,auVar47,auVar48);
            *pauVar18 = auVar31;
            pauVar18[1] = auVar29;
            uVar20 = auVar30._0_8_;
            pauVar18 = pauVar18 + 2;
          }
          else {
            lVar16 = 0;
            for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            auVar64._8_8_ = 0;
            auVar64._0_8_ = *(ulong *)(uVar10 + lVar16 * 8);
            auVar53 = vpunpcklqdq_avx(auVar64,ZEXT416(*(uint *)(local_10c0 + lVar16 * 4)));
            auVar48 = vpshufd_avx(auVar47,0xaa);
            auVar47 = vblendvps_avx(auVar30,auVar31,auVar48);
            auVar31 = vblendvps_avx(auVar31,auVar30,auVar48);
            auVar30 = vpcmpgtd_avx(auVar53,auVar29);
            auVar48 = vpshufd_avx(auVar30,0xaa);
            auVar30 = vblendvps_avx(auVar53,auVar29,auVar48);
            auVar29 = vblendvps_avx(auVar29,auVar53,auVar48);
            auVar48 = vpcmpgtd_avx(auVar29,auVar31);
            auVar53 = vpshufd_avx(auVar48,0xaa);
            auVar48 = vblendvps_avx(auVar29,auVar31,auVar53);
            auVar31 = vblendvps_avx(auVar31,auVar29,auVar53);
            auVar29 = vpcmpgtd_avx(auVar30,auVar47);
            auVar53 = vpshufd_avx(auVar29,0xaa);
            auVar29 = vblendvps_avx(auVar30,auVar47,auVar53);
            auVar30 = vblendvps_avx(auVar47,auVar30,auVar53);
            auVar47 = vpcmpgtd_avx(auVar48,auVar30);
            auVar53 = vpshufd_avx(auVar47,0xaa);
            auVar47 = vblendvps_avx(auVar48,auVar30,auVar53);
            auVar30 = vblendvps_avx(auVar30,auVar48,auVar53);
            *pauVar18 = auVar31;
            pauVar18[1] = auVar30;
            pauVar18[2] = auVar47;
            auVar74 = ZEXT1664(local_12a0);
            uVar20 = auVar29._0_8_;
            pauVar18 = pauVar18 + 3;
          }
        }
      }
    }
    local_12e0 = (ulong)((uint)uVar20 & 0xf) - 8;
    uVar20 = uVar20 & 0xfffffffffffffff0;
    for (lVar16 = 0; lVar16 != local_12e0; lVar16 = lVar16 + 1) {
      lVar13 = lVar16 * 0x140;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar55._4_4_ = uVar9;
      auVar55._0_4_ = uVar9;
      auVar55._8_4_ = uVar9;
      auVar55._12_4_ = uVar9;
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x90 + lVar13),auVar55,
                                *(undefined1 (*) [16])(uVar20 + lVar13));
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xa0 + lVar13),auVar55,
                                *(undefined1 (*) [16])(uVar20 + 0x10 + lVar13));
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xb0 + lVar13),auVar55,
                                *(undefined1 (*) [16])(uVar20 + 0x20 + lVar13));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xc0 + lVar13),auVar55,
                                *(undefined1 (*) [16])(uVar20 + 0x30 + lVar13));
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xd0 + lVar13),auVar55,
                                *(undefined1 (*) [16])(uVar20 + 0x40 + lVar13));
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xe0 + lVar13),auVar55,
                                *(undefined1 (*) [16])(uVar20 + 0x50 + lVar13));
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xf0 + lVar13),auVar55,
                                *(undefined1 (*) [16])(uVar20 + 0x60 + lVar13));
      auVar63 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x100 + lVar13),auVar55,
                                *(undefined1 (*) [16])(uVar20 + 0x70 + lVar13));
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x110 + lVar13),auVar55,
                                *(undefined1 (*) [16])(uVar20 + 0x80 + lVar13));
      uVar9 = *(undefined4 *)(ray + k * 4);
      auVar56._4_4_ = uVar9;
      auVar56._0_4_ = uVar9;
      auVar56._8_4_ = uVar9;
      auVar56._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar97._4_4_ = uVar9;
      auVar97._0_4_ = uVar9;
      auVar97._8_4_ = uVar9;
      auVar97._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar105._4_4_ = uVar9;
      auVar105._0_4_ = uVar9;
      auVar105._8_4_ = uVar9;
      auVar105._12_4_ = uVar9;
      local_1320 = vsubps_avx(auVar31,auVar56);
      local_1330 = vsubps_avx(auVar30,auVar97);
      local_1340 = vsubps_avx(auVar47,auVar105);
      auVar31 = vsubps_avx(auVar29,auVar56);
      auVar30 = vsubps_avx(auVar48,auVar97);
      auVar47 = vsubps_avx(auVar53,auVar105);
      auVar29 = vsubps_avx(auVar54,auVar56);
      auVar48 = vsubps_avx(auVar63,auVar97);
      auVar53 = vsubps_avx(auVar39,auVar105);
      auVar54 = vsubps_avx(auVar29,local_1320);
      local_10f0 = vsubps_avx(auVar48,local_1330);
      auVar63 = vsubps_avx(auVar53,local_1340);
      auVar23._0_4_ = auVar29._0_4_ + local_1320._0_4_;
      auVar23._4_4_ = auVar29._4_4_ + local_1320._4_4_;
      auVar23._8_4_ = auVar29._8_4_ + local_1320._8_4_;
      auVar23._12_4_ = auVar29._12_4_ + local_1320._12_4_;
      auVar50._0_4_ = auVar48._0_4_ + local_1330._0_4_;
      auVar50._4_4_ = auVar48._4_4_ + local_1330._4_4_;
      auVar50._8_4_ = auVar48._8_4_ + local_1330._8_4_;
      auVar50._12_4_ = auVar48._12_4_ + local_1330._12_4_;
      fVar95 = local_1340._0_4_;
      auVar57._0_4_ = auVar53._0_4_ + fVar95;
      fVar104 = local_1340._4_4_;
      auVar57._4_4_ = auVar53._4_4_ + fVar104;
      fVar110 = local_1340._8_4_;
      auVar57._8_4_ = auVar53._8_4_ + fVar110;
      fVar82 = local_1340._12_4_;
      auVar57._12_4_ = auVar53._12_4_ + fVar82;
      auVar98._0_4_ = auVar50._0_4_ * auVar63._0_4_;
      auVar98._4_4_ = auVar50._4_4_ * auVar63._4_4_;
      auVar98._8_4_ = auVar50._8_4_ * auVar63._8_4_;
      auVar98._12_4_ = auVar50._12_4_ * auVar63._12_4_;
      auVar49 = vfmsub231ps_fma(auVar98,local_10f0,auVar57);
      auVar58._0_4_ = auVar57._0_4_ * auVar54._0_4_;
      auVar58._4_4_ = auVar57._4_4_ * auVar54._4_4_;
      auVar58._8_4_ = auVar57._8_4_ * auVar54._8_4_;
      auVar58._12_4_ = auVar57._12_4_ * auVar54._12_4_;
      auVar39 = vfmsub231ps_fma(auVar58,auVar63,auVar23);
      auVar24._0_4_ = local_10f0._0_4_ * auVar23._0_4_;
      auVar24._4_4_ = local_10f0._4_4_ * auVar23._4_4_;
      auVar24._8_4_ = local_10f0._8_4_ * auVar23._8_4_;
      auVar24._12_4_ = local_10f0._12_4_ * auVar23._12_4_;
      auVar64 = vfmsub231ps_fma(auVar24,auVar54,auVar50);
      local_1370._4_4_ = *(float *)(ray + k * 4 + 0xc0);
      auVar79._0_4_ = local_1370._4_4_ * auVar64._0_4_;
      auVar79._4_4_ = local_1370._4_4_ * auVar64._4_4_;
      auVar79._8_4_ = local_1370._4_4_ * auVar64._8_4_;
      auVar79._12_4_ = local_1370._4_4_ * auVar64._12_4_;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar90._4_4_ = uVar9;
      auVar90._0_4_ = uVar9;
      auVar90._8_4_ = uVar9;
      auVar90._12_4_ = uVar9;
      auVar39 = vfmadd231ps_fma(auVar79,auVar90,auVar39);
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar106._4_4_ = uVar9;
      auVar106._0_4_ = uVar9;
      auVar106._8_4_ = uVar9;
      auVar106._12_4_ = uVar9;
      local_1120 = vfmadd231ps_fma(auVar39,auVar106,auVar49);
      local_1100 = vsubps_avx(local_1330,auVar30);
      local_1110 = vsubps_avx(local_1340,auVar47);
      auVar51._0_4_ = local_1330._0_4_ + auVar30._0_4_;
      auVar51._4_4_ = local_1330._4_4_ + auVar30._4_4_;
      auVar51._8_4_ = local_1330._8_4_ + auVar30._8_4_;
      auVar51._12_4_ = local_1330._12_4_ + auVar30._12_4_;
      auVar59._0_4_ = fVar95 + auVar47._0_4_;
      auVar59._4_4_ = fVar104 + auVar47._4_4_;
      auVar59._8_4_ = fVar110 + auVar47._8_4_;
      auVar59._12_4_ = fVar82 + auVar47._12_4_;
      fVar89 = local_1110._0_4_;
      auVar68._0_4_ = auVar51._0_4_ * fVar89;
      fVar86 = local_1110._4_4_;
      auVar68._4_4_ = auVar51._4_4_ * fVar86;
      fVar88 = local_1110._8_4_;
      auVar68._8_4_ = auVar51._8_4_ * fVar88;
      fVar92 = local_1110._12_4_;
      auVar68._12_4_ = auVar51._12_4_ * fVar92;
      auVar64 = vfmsub231ps_fma(auVar68,local_1100,auVar59);
      auVar39 = vsubps_avx(local_1320,auVar31);
      fVar94 = auVar39._0_4_;
      auVar75._0_4_ = auVar59._0_4_ * fVar94;
      fVar87 = auVar39._4_4_;
      auVar75._4_4_ = auVar59._4_4_ * fVar87;
      fVar91 = auVar39._8_4_;
      auVar75._8_4_ = auVar59._8_4_ * fVar91;
      fVar93 = auVar39._12_4_;
      auVar75._12_4_ = auVar59._12_4_ * fVar93;
      auVar60._0_4_ = local_1320._0_4_ + auVar31._0_4_;
      auVar60._4_4_ = local_1320._4_4_ + auVar31._4_4_;
      auVar60._8_4_ = local_1320._8_4_ + auVar31._8_4_;
      auVar60._12_4_ = local_1320._12_4_ + auVar31._12_4_;
      auVar49 = vfmsub231ps_fma(auVar75,local_1110,auVar60);
      fVar96 = local_1100._0_4_;
      auVar61._0_4_ = fVar96 * auVar60._0_4_;
      fVar99 = local_1100._4_4_;
      auVar61._4_4_ = fVar99 * auVar60._4_4_;
      fVar101 = local_1100._8_4_;
      auVar61._8_4_ = fVar101 * auVar60._8_4_;
      fVar103 = local_1100._12_4_;
      auVar61._12_4_ = fVar103 * auVar60._12_4_;
      auVar23 = vfmsub231ps_fma(auVar61,auVar39,auVar51);
      auVar62._0_4_ = local_1370._4_4_ * auVar23._0_4_;
      auVar62._4_4_ = local_1370._4_4_ * auVar23._4_4_;
      auVar62._8_4_ = local_1370._4_4_ * auVar23._8_4_;
      auVar62._12_4_ = local_1370._4_4_ * auVar23._12_4_;
      auVar49 = vfmadd231ps_fma(auVar62,auVar90,auVar49);
      local_1280 = vfmadd231ps_fma(auVar49,auVar106,auVar64);
      auVar49 = vsubps_avx(auVar31,auVar29);
      auVar40._0_4_ = auVar31._0_4_ + auVar29._0_4_;
      auVar40._4_4_ = auVar31._4_4_ + auVar29._4_4_;
      auVar40._8_4_ = auVar31._8_4_ + auVar29._8_4_;
      auVar40._12_4_ = auVar31._12_4_ + auVar29._12_4_;
      auVar29 = vsubps_avx(auVar30,auVar48);
      auVar32._0_4_ = auVar30._0_4_ + auVar48._0_4_;
      auVar32._4_4_ = auVar30._4_4_ + auVar48._4_4_;
      auVar32._8_4_ = auVar30._8_4_ + auVar48._8_4_;
      auVar32._12_4_ = auVar30._12_4_ + auVar48._12_4_;
      auVar48 = vsubps_avx(auVar47,auVar53);
      auVar65._0_4_ = auVar47._0_4_ + auVar53._0_4_;
      auVar65._4_4_ = auVar47._4_4_ + auVar53._4_4_;
      auVar65._8_4_ = auVar47._8_4_ + auVar53._8_4_;
      auVar65._12_4_ = auVar47._12_4_ + auVar53._12_4_;
      auVar69._0_4_ = auVar48._0_4_ * auVar32._0_4_;
      auVar69._4_4_ = auVar48._4_4_ * auVar32._4_4_;
      auVar69._8_4_ = auVar48._8_4_ * auVar32._8_4_;
      auVar69._12_4_ = auVar48._12_4_ * auVar32._12_4_;
      auVar30 = vfmsub231ps_fma(auVar69,auVar29,auVar65);
      auVar66._0_4_ = auVar65._0_4_ * auVar49._0_4_;
      auVar66._4_4_ = auVar65._4_4_ * auVar49._4_4_;
      auVar66._8_4_ = auVar65._8_4_ * auVar49._8_4_;
      auVar66._12_4_ = auVar65._12_4_ * auVar49._12_4_;
      auVar31 = vfmsub231ps_fma(auVar66,auVar48,auVar40);
      auVar41._0_4_ = auVar29._0_4_ * auVar40._0_4_;
      auVar41._4_4_ = auVar29._4_4_ * auVar40._4_4_;
      auVar41._8_4_ = auVar29._8_4_ * auVar40._8_4_;
      auVar41._12_4_ = auVar29._12_4_ * auVar40._12_4_;
      auVar47 = vfmsub231ps_fma(auVar41,auVar49,auVar32);
      local_1370._0_4_ = local_1370._4_4_;
      fStack_1368 = local_1370._4_4_;
      fStack_1364 = local_1370._4_4_;
      auVar42._0_4_ = local_1370._4_4_ * auVar47._0_4_;
      auVar42._4_4_ = local_1370._4_4_ * auVar47._4_4_;
      auVar42._8_4_ = local_1370._4_4_ * auVar47._8_4_;
      auVar42._12_4_ = local_1370._4_4_ * auVar47._12_4_;
      auVar31 = vfmadd231ps_fma(auVar42,auVar90,auVar31);
      auVar47 = vfmadd231ps_fma(auVar31,auVar106,auVar30);
      local_1290 = local_1120._0_4_;
      fStack_128c = local_1120._4_4_;
      fStack_1288 = local_1120._8_4_;
      fStack_1284 = local_1120._12_4_;
      local_1270._0_4_ = auVar47._0_4_ + local_1290 + local_1280._0_4_;
      local_1270._4_4_ = auVar47._4_4_ + fStack_128c + local_1280._4_4_;
      local_1270._8_4_ = auVar47._8_4_ + fStack_1288 + local_1280._8_4_;
      local_1270._12_4_ = auVar47._12_4_ + fStack_1284 + local_1280._12_4_;
      auVar33._8_4_ = 0x7fffffff;
      auVar33._0_8_ = 0x7fffffff7fffffff;
      auVar33._12_4_ = 0x7fffffff;
      auVar31 = vminps_avx(local_1120,local_1280);
      auVar31 = vminps_avx(auVar31,auVar47);
      local_1130 = vandps_avx(local_1270,auVar33);
      auVar76._0_4_ = local_1130._0_4_ * 1.1920929e-07;
      auVar76._4_4_ = local_1130._4_4_ * 1.1920929e-07;
      auVar76._8_4_ = local_1130._8_4_ * 1.1920929e-07;
      auVar76._12_4_ = local_1130._12_4_ * 1.1920929e-07;
      uVar10 = CONCAT44(auVar76._4_4_,auVar76._0_4_);
      auVar70._0_8_ = uVar10 ^ 0x8000000080000000;
      auVar70._8_4_ = -auVar76._8_4_;
      auVar70._12_4_ = -auVar76._12_4_;
      auVar31 = vcmpps_avx(auVar31,auVar70,5);
      auVar30 = vmaxps_avx(local_1120,local_1280);
      auVar30 = vmaxps_avx(auVar30,auVar47);
      auVar30 = vcmpps_avx(auVar30,auVar76,2);
      auVar31 = vorps_avx(auVar31,auVar30);
      if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0'
         ) {
        auVar43._0_4_ = auVar63._0_4_ * fVar96;
        auVar43._4_4_ = auVar63._4_4_ * fVar99;
        auVar43._8_4_ = auVar63._8_4_ * fVar101;
        auVar43._12_4_ = auVar63._12_4_ * fVar103;
        auVar71._0_4_ = fVar94 * local_10f0._0_4_;
        auVar71._4_4_ = fVar87 * local_10f0._4_4_;
        auVar71._8_4_ = fVar91 * local_10f0._8_4_;
        auVar71._12_4_ = fVar93 * local_10f0._12_4_;
        auVar53 = vfmsub213ps_fma(local_10f0,local_1110,auVar43);
        auVar67._0_4_ = auVar29._0_4_ * fVar89;
        auVar67._4_4_ = auVar29._4_4_ * fVar86;
        auVar67._8_4_ = auVar29._8_4_ * fVar88;
        auVar67._12_4_ = auVar29._12_4_ * fVar92;
        auVar77._0_4_ = fVar94 * auVar48._0_4_;
        auVar77._4_4_ = fVar87 * auVar48._4_4_;
        auVar77._8_4_ = fVar91 * auVar48._8_4_;
        auVar77._12_4_ = fVar93 * auVar48._12_4_;
        auVar48 = vfmsub213ps_fma(auVar48,local_1100,auVar67);
        auVar30 = vandps_avx(auVar43,auVar33);
        auVar47 = vandps_avx(auVar67,auVar33);
        auVar30 = vcmpps_avx(auVar30,auVar47,1);
        local_1210 = vblendvps_avx(auVar48,auVar53,auVar30);
        auVar83._0_4_ = auVar49._0_4_ * fVar96;
        auVar83._4_4_ = auVar49._4_4_ * fVar99;
        auVar83._8_4_ = auVar49._8_4_ * fVar101;
        auVar83._12_4_ = auVar49._12_4_ * fVar103;
        auVar48 = vfmsub213ps_fma(auVar49,local_1110,auVar77);
        auVar44._0_4_ = auVar54._0_4_ * fVar89;
        auVar44._4_4_ = auVar54._4_4_ * fVar86;
        auVar44._8_4_ = auVar54._8_4_ * fVar88;
        auVar44._12_4_ = auVar54._12_4_ * fVar92;
        auVar53 = vfmsub213ps_fma(auVar63,auVar39,auVar44);
        auVar30 = vandps_avx(auVar44,auVar33);
        auVar47 = vandps_avx(auVar77,auVar33);
        auVar30 = vcmpps_avx(auVar30,auVar47,1);
        local_1200 = vblendvps_avx(auVar48,auVar53,auVar30);
        auVar48 = vfmsub213ps_fma(auVar54,local_1100,auVar71);
        auVar29 = vfmsub213ps_fma(auVar29,auVar39,auVar83);
        auVar30 = vandps_avx(auVar71,auVar33);
        auVar47 = vandps_avx(auVar83,auVar33);
        auVar30 = vcmpps_avx(auVar30,auVar47,1);
        local_11f0 = vblendvps_avx(auVar29,auVar48,auVar30);
        auVar34._0_4_ = local_11f0._0_4_ * local_1370._4_4_;
        auVar34._4_4_ = local_11f0._4_4_ * local_1370._4_4_;
        auVar34._8_4_ = local_11f0._8_4_ * local_1370._4_4_;
        auVar34._12_4_ = local_11f0._12_4_ * local_1370._4_4_;
        auVar30 = vfmadd213ps_fma(auVar90,local_1200,auVar34);
        auVar30 = vfmadd213ps_fma(auVar106,local_1210,auVar30);
        auVar35._0_4_ = auVar30._0_4_ + auVar30._0_4_;
        auVar35._4_4_ = auVar30._4_4_ + auVar30._4_4_;
        auVar35._8_4_ = auVar30._8_4_ + auVar30._8_4_;
        auVar35._12_4_ = auVar30._12_4_ + auVar30._12_4_;
        auVar72._0_4_ = local_11f0._0_4_ * fVar95;
        auVar72._4_4_ = local_11f0._4_4_ * fVar104;
        auVar72._8_4_ = local_11f0._8_4_ * fVar110;
        auVar72._12_4_ = local_11f0._12_4_ * fVar82;
        auVar30 = vfmadd213ps_fma(local_1330,local_1200,auVar72);
        auVar47 = vfmadd213ps_fma(local_1320,local_1210,auVar30);
        auVar30 = vrcpps_avx(auVar35);
        auVar84._8_4_ = 0x3f800000;
        auVar84._0_8_ = 0x3f8000003f800000;
        auVar84._12_4_ = 0x3f800000;
        auVar29 = vfnmadd213ps_fma(auVar30,auVar35,auVar84);
        auVar30 = vfmadd132ps_fma(auVar29,auVar30,auVar30);
        local_1220._0_4_ = auVar30._0_4_ * (auVar47._0_4_ + auVar47._0_4_);
        local_1220._4_4_ = auVar30._4_4_ * (auVar47._4_4_ + auVar47._4_4_);
        local_1220._8_4_ = auVar30._8_4_ * (auVar47._8_4_ + auVar47._8_4_);
        local_1220._12_4_ = auVar30._12_4_ * (auVar47._12_4_ + auVar47._12_4_);
        auVar28 = ZEXT1664(local_1220);
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar73._4_4_ = uVar9;
        auVar73._0_4_ = uVar9;
        auVar73._8_4_ = uVar9;
        auVar73._12_4_ = uVar9;
        auVar30 = vcmpps_avx(auVar73,local_1220,2);
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar85._4_4_ = uVar9;
        auVar85._0_4_ = uVar9;
        auVar85._8_4_ = uVar9;
        auVar85._12_4_ = uVar9;
        auVar74 = ZEXT1664(auVar85);
        auVar47 = vcmpps_avx(local_1220,auVar85,2);
        auVar30 = vandps_avx(auVar30,auVar47);
        auVar29 = auVar31 & auVar30;
        if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar29[0xf] < '\0') {
          auVar31 = vandps_avx(auVar31,auVar30);
          auVar30 = vcmpps_avx(auVar35,_DAT_01f45a50,4);
          auVar29 = auVar30 & auVar31;
          if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar29[0xf] < '\0') {
            local_1300 = vandps_avx(auVar31,auVar30);
            local_1260 = &local_1389;
            uStack_1308 = auVar106._8_8_;
            local_1310 = context->scene;
            auVar31 = vrcpps_avx(local_1270);
            auVar52._8_4_ = 0x3f800000;
            auVar52._0_8_ = 0x3f8000003f800000;
            auVar52._12_4_ = 0x3f800000;
            auVar30 = vfnmadd213ps_fma(local_1270,auVar31,auVar52);
            auVar30 = vfmadd132ps_fma(auVar30,auVar31,auVar31);
            auVar45._8_4_ = 0x219392ef;
            auVar45._0_8_ = 0x219392ef219392ef;
            auVar45._12_4_ = 0x219392ef;
            auVar31 = vcmpps_avx(local_1130,auVar45,5);
            auVar31 = vandps_avx(auVar30,auVar31);
            auVar25._0_4_ = local_1290 * auVar31._0_4_;
            auVar25._4_4_ = fStack_128c * auVar31._4_4_;
            auVar25._8_4_ = fStack_1288 * auVar31._8_4_;
            auVar25._12_4_ = fStack_1284 * auVar31._12_4_;
            local_1240 = vminps_avx(auVar25,auVar52);
            auVar26._0_4_ = auVar31._0_4_ * local_1280._0_4_;
            auVar26._4_4_ = auVar31._4_4_ * local_1280._4_4_;
            auVar26._8_4_ = auVar31._8_4_ * local_1280._8_4_;
            auVar26._12_4_ = auVar31._12_4_ * local_1280._12_4_;
            local_1230 = vminps_avx(auVar26,auVar52);
            auVar46._8_4_ = 0x7f800000;
            auVar46._0_8_ = 0x7f8000007f800000;
            auVar46._12_4_ = 0x7f800000;
            auVar31 = vblendvps_avx(auVar46,local_1220,local_1300);
            auVar30 = vshufps_avx(auVar31,auVar31,0xb1);
            auVar30 = vminps_avx(auVar30,auVar31);
            auVar29 = vshufpd_avx(auVar30,auVar30,1);
            auVar30 = vminps_avx(auVar29,auVar30);
            auVar31 = vcmpps_avx(auVar31,auVar30,0);
            auVar29 = local_1300 & auVar31;
            auVar30 = vpcmpeqd_avx(auVar30,auVar30);
            if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar29[0xf] < '\0') {
              auVar30 = auVar31;
            }
            lVar13 = lVar13 + uVar20;
            auVar31 = vandps_avx(local_1300,auVar30);
            uVar9 = vmovmskps_avx(auVar31);
            lVar14 = 0;
            for (uVar10 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar9); (uVar10 & 1) == 0;
                uVar10 = uVar10 >> 1 | 0x8000000000000000) {
              lVar14 = lVar14 + 1;
            }
            auVar37 = vpcmpeqd_avx2(ZEXT1632(auVar47),ZEXT1632(auVar47));
            auVar78 = ZEXT3264(auVar37);
            uStack_1378 = auVar90._8_8_;
            local_1380 = lVar13;
            local_1250 = local_1300;
            do {
              uVar11 = *(uint *)(lVar13 + 0x120 + lVar14 * 4);
              uVar10 = (ulong)uVar11;
              lVar13 = *(long *)(*(long *)((long)local_1310 + 0x1e8) + uVar10 * 8);
              local_1370 = lVar13;
              if ((*(uint *)(lVar13 + 0x34) & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1300 + lVar14 * 4) = 0;
                lVar13 = local_1380;
              }
              else {
                local_1320._0_8_ = lVar14;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (*(long *)(lVar13 + 0x40) == 0)) {
                  uVar9 = *(undefined4 *)(local_1240 + lVar14 * 4);
                  uVar1 = *(undefined4 *)(local_1230 + lVar14 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1220 + lVar14 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1210 + lVar14 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1200 + lVar14 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11f0 + lVar14 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar9;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)(local_1380 + 0x130 + lVar14 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar11;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_1060 = *(undefined4 *)(local_1240 + lVar14 * 4);
                local_1040 = *(undefined4 *)(local_1230 + lVar14 * 4);
                uVar9 = *(undefined4 *)(local_1380 + 0x130 + lVar14 * 4);
                local_1020._4_4_ = uVar9;
                local_1020._0_4_ = uVar9;
                local_1020._8_4_ = uVar9;
                local_1020._12_4_ = uVar9;
                local_1020._16_4_ = uVar9;
                local_1020._20_4_ = uVar9;
                local_1020._24_4_ = uVar9;
                local_1020._28_4_ = uVar9;
                uVar9 = *(undefined4 *)(local_1210 + lVar14 * 4);
                uVar1 = *(undefined4 *)(local_1200 + lVar14 * 4);
                local_10a0._4_4_ = uVar1;
                local_10a0._0_4_ = uVar1;
                local_10a0._8_4_ = uVar1;
                local_10a0._12_4_ = uVar1;
                local_10a0._16_4_ = uVar1;
                local_10a0._20_4_ = uVar1;
                local_10a0._24_4_ = uVar1;
                local_10a0._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_11f0 + lVar14 * 4);
                local_1080._4_4_ = uVar1;
                local_1080._0_4_ = uVar1;
                local_1080._8_4_ = uVar1;
                local_1080._12_4_ = uVar1;
                local_1080._16_4_ = uVar1;
                local_1080._20_4_ = uVar1;
                local_1080._24_4_ = uVar1;
                local_1080._28_4_ = uVar1;
                local_1000._4_4_ = uVar11;
                local_1000._0_4_ = uVar11;
                local_1000._8_4_ = uVar11;
                local_1000._12_4_ = uVar11;
                local_1000._16_4_ = uVar11;
                local_1000._20_4_ = uVar11;
                local_1000._24_4_ = uVar11;
                local_1000._28_4_ = uVar11;
                local_10c0[0] = (RTCHitN)(char)uVar9;
                local_10c0[1] = (RTCHitN)(char)((uint)uVar9 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                local_10c0[4] = (RTCHitN)(char)uVar9;
                local_10c0[5] = (RTCHitN)(char)((uint)uVar9 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                local_10c0[8] = (RTCHitN)(char)uVar9;
                local_10c0[9] = (RTCHitN)(char)((uint)uVar9 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                local_10c0[0xc] = (RTCHitN)(char)uVar9;
                local_10c0[0xd] = (RTCHitN)(char)((uint)uVar9 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                local_10c0[0x10] = (RTCHitN)(char)uVar9;
                local_10c0[0x11] = (RTCHitN)(char)((uint)uVar9 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                local_10c0[0x14] = (RTCHitN)(char)uVar9;
                local_10c0[0x15] = (RTCHitN)(char)((uint)uVar9 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                local_10c0[0x18] = (RTCHitN)(char)uVar9;
                local_10c0[0x19] = (RTCHitN)(char)((uint)uVar9 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)(char)uVar9;
                local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar9 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                uStack_105c = local_1060;
                uStack_1058 = local_1060;
                uStack_1054 = local_1060;
                uStack_1050 = local_1060;
                uStack_104c = local_1060;
                uStack_1048 = local_1060;
                uStack_1044 = local_1060;
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1220 + lVar14 * 4);
                local_11e0 = local_10e0;
                local_12d0.valid = (int *)local_11e0;
                local_12d0.geometryUserPtr = *(void **)(lVar13 + 0x18);
                local_12d0.context = context->user;
                local_12d0.hit = local_10c0;
                local_12d0.N = 8;
                local_12d0.ray = (RTCRayN *)ray;
                if (*(code **)(lVar13 + 0x40) != (code *)0x0) {
                  local_1330._0_8_ = pauVar18;
                  local_1340._0_8_ = lVar16;
                  local_1350 = auVar28._0_16_;
                  local_1360 = auVar74._0_16_;
                  auVar37 = ZEXT1632(auVar78._0_16_);
                  (**(code **)(lVar13 + 0x40))(&local_12d0);
                  auVar74 = ZEXT1664(local_1360);
                  auVar28 = ZEXT1664(local_1350);
                  auVar37 = vpcmpeqd_avx2(auVar37,auVar37);
                  auVar78 = ZEXT3264(auVar37);
                  lVar16 = local_1340._0_8_;
                  uVar17 = local_1388;
                  k = local_12f0;
                  ray = local_12e8;
                  pauVar18 = (undefined1 (*) [16])local_1330._0_8_;
                }
                auVar6 = vpcmpeqd_avx2(local_11e0,_DAT_01f7b000);
                auVar37 = auVar78._0_32_ & ~auVar6;
                if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar37 >> 0x7f,0) == '\0') &&
                      (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar37 >> 0xbf,0) == '\0') &&
                    (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar37[0x1f]) {
                  auVar6 = auVar6 ^ auVar78._0_32_;
                }
                else {
                  p_Var4 = context->args->filter;
                  if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(local_1370 + 0x3e) & 0x40) != 0)
                      ))) {
                    local_1330._0_8_ = pauVar18;
                    local_1340._0_8_ = lVar16;
                    local_1350 = auVar28._0_16_;
                    local_1360 = auVar74._0_16_;
                    auVar37 = ZEXT1632(auVar78._0_16_);
                    (*p_Var4)(&local_12d0);
                    auVar74 = ZEXT1664(local_1360);
                    auVar28 = ZEXT1664(local_1350);
                    auVar37 = vpcmpeqd_avx2(auVar37,auVar37);
                    auVar78 = ZEXT3264(auVar37);
                    lVar16 = local_1340._0_8_;
                    uVar17 = local_1388;
                    k = local_12f0;
                    ray = local_12e8;
                    pauVar18 = (undefined1 (*) [16])local_1330._0_8_;
                  }
                  auVar5 = vpcmpeqd_avx2(local_11e0,_DAT_01f7b000);
                  auVar6 = auVar5 ^ auVar78._0_32_;
                  auVar37 = auVar78._0_32_ & ~auVar5;
                  if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar37 >> 0x7f,0) != '\0') ||
                        (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar37 >> 0xbf,0) != '\0') ||
                      (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar37[0x1f] < '\0') {
                    auVar38._0_4_ = auVar5._0_4_ ^ auVar78._0_4_;
                    auVar38._4_4_ = auVar5._4_4_ ^ auVar78._4_4_;
                    auVar38._8_4_ = auVar5._8_4_ ^ auVar78._8_4_;
                    auVar38._12_4_ = auVar5._12_4_ ^ auVar78._12_4_;
                    auVar38._16_4_ = auVar5._16_4_ ^ auVar78._16_4_;
                    auVar38._20_4_ = auVar5._20_4_ ^ auVar78._20_4_;
                    auVar38._24_4_ = auVar5._24_4_ ^ auVar78._24_4_;
                    auVar38._28_4_ = auVar5._28_4_ ^ auVar78._28_4_;
                    auVar37 = vmaskmovps_avx(auVar38,*(undefined1 (*) [32])local_12d0.hit);
                    *(undefined1 (*) [32])(local_12d0.ray + 0x180) = auVar37;
                    auVar37 = vmaskmovps_avx(auVar38,*(undefined1 (*) [32])(local_12d0.hit + 0x20));
                    *(undefined1 (*) [32])(local_12d0.ray + 0x1a0) = auVar37;
                    auVar37 = vmaskmovps_avx(auVar38,*(undefined1 (*) [32])(local_12d0.hit + 0x40));
                    *(undefined1 (*) [32])(local_12d0.ray + 0x1c0) = auVar37;
                    auVar37 = vmaskmovps_avx(auVar38,*(undefined1 (*) [32])(local_12d0.hit + 0x60));
                    *(undefined1 (*) [32])(local_12d0.ray + 0x1e0) = auVar37;
                    auVar37 = vmaskmovps_avx(auVar38,*(undefined1 (*) [32])(local_12d0.hit + 0x80));
                    *(undefined1 (*) [32])(local_12d0.ray + 0x200) = auVar37;
                    auVar37 = vpmaskmovd_avx2(auVar38,*(undefined1 (*) [32])(local_12d0.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_12d0.ray + 0x220) = auVar37;
                    auVar37 = vpmaskmovd_avx2(auVar38,*(undefined1 (*) [32])(local_12d0.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_12d0.ray + 0x240) = auVar37;
                    auVar37 = vpmaskmovd_avx2(auVar38,*(undefined1 (*) [32])(local_12d0.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_12d0.ray + 0x260) = auVar37;
                    auVar37 = vpmaskmovd_avx2(auVar38,*(undefined1 (*) [32])(local_12d0.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_12d0.ray + 0x280) = auVar37;
                  }
                }
                if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar6 >> 0x7f,0) == '\0') &&
                      (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar6 >> 0xbf,0) == '\0') &&
                    (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar6[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar74._0_4_;
                }
                else {
                  auVar74 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_1300 + local_1320._0_8_ * 4) = 0;
                uVar9 = auVar74._0_4_;
                auVar27._4_4_ = uVar9;
                auVar27._0_4_ = uVar9;
                auVar27._8_4_ = uVar9;
                auVar27._12_4_ = uVar9;
                auVar31 = vcmpps_avx(auVar28._0_16_,auVar27,2);
                local_1300 = vandps_avx(auVar31,local_1300);
                uVar10 = local_1320._0_8_;
                lVar13 = local_1380;
              }
              if ((((local_1300 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_1300 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_1300 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_1300[0xf]) break;
              auVar36._8_4_ = 0x7f800000;
              auVar36._0_8_ = 0x7f8000007f800000;
              auVar36._12_4_ = 0x7f800000;
              auVar31 = vblendvps_avx(auVar36,auVar28._0_16_,local_1300);
              auVar30 = vshufps_avx(auVar31,auVar31,0xb1);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar47 = vshufpd_avx(auVar30,auVar30,1);
              auVar30 = vminps_avx(auVar47,auVar30);
              auVar30 = vcmpps_avx(auVar31,auVar30,0);
              auVar47 = local_1300 & auVar30;
              auVar31 = local_1300;
              if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar47[0xf] < '\0') {
                auVar31 = vandps_avx(auVar30,local_1300);
              }
              uVar9 = vmovmskps_avx(auVar31);
              lVar14 = 0;
              for (uVar10 = CONCAT44((int)(uVar10 >> 0x20),uVar9); (uVar10 & 1) == 0;
                  uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                lVar14 = lVar14 + 1;
              }
            } while( true );
          }
        }
      }
      auVar78 = ZEXT1664(local_1140);
      auVar80 = ZEXT1664(local_1150);
      auVar81 = ZEXT1664(local_1160);
      auVar74 = ZEXT1664(local_12a0);
      fVar82 = local_1170;
      fVar86 = fStack_116c;
      fVar87 = fStack_1168;
      fVar88 = fStack_1164;
      fVar89 = local_1180;
      fVar91 = fStack_117c;
      fVar92 = fStack_1178;
      fVar93 = fStack_1174;
      fVar94 = local_1190;
      fVar96 = fStack_118c;
      fVar99 = fStack_1188;
      fVar101 = fStack_1184;
      fVar95 = local_11a0;
      fVar103 = fStack_119c;
      fVar100 = fStack_1198;
      fVar102 = fStack_1194;
      fVar104 = local_11b0;
      fVar107 = fStack_11ac;
      fVar108 = fStack_11a8;
      fVar109 = fStack_11a4;
      fVar110 = local_11c0;
      fVar111 = fStack_11bc;
      fVar112 = fStack_11b8;
      fVar113 = fStack_11b4;
    }
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar28 = ZEXT1664(CONCAT412(uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }